

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

string * handle_server_page_abi_cxx11_(string_view query_string)

{
  Server *server;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  unsigned_short uVar2;
  string *this;
  mapped_type *pmVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string;
  long lVar6;
  string_view __y;
  unsigned_short port;
  allocator<char> local_b9;
  key_type local_b8;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  table;
  string parsed_query_string;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view query_string_local;
  
  query_string_local._M_str = query_string._M_str;
  query_string_local._M_len = query_string._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&parsed_query_string,&query_string_local,(allocator<char> *)&table);
  table._M_h._M_buckets = &table._M_h._M_single_bucket;
  table._M_h._M_bucket_count = 1;
  table._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  table._M_h._M_element_count = 0;
  table._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  table._M_h._M_rehash_policy._M_next_resize = 0;
  table._M_h._M_single_bucket = (__node_base_ptr)0x0;
  jessilib::
  deserialize_html_form<char,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_nullptr>
            ((jessilib *)&table,
             (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)&parsed_query_string,inout_string);
  port = 0;
  if (table._M_h._M_element_count < 2) {
    this = (string *)operator_new(0x20);
    (this->_M_dataplus)._M_p = (pointer)&this->field_2;
    this->_M_string_length = 0;
    (this->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_b8._M_len = 2;
    local_b8._M_str = "ip";
    pmVar3 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&table,&local_b8);
    __x._M_len = pmVar3->_M_len;
    __x._M_str = pmVar3->_M_str;
    local_b8._M_len = 4;
    local_b8._M_str = "port";
    pmVar3 = std::__detail::
             _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&table,&local_b8);
    std::from_chars<unsigned_short>(pmVar3->_M_str,pmVar3->_M_str + pmVar3->_M_len,&port,10);
    RenX::getCore();
    RenX::Core::getServers();
    for (lVar6 = 0; lVar6 != (long)((long)local_b8._M_str - local_b8._M_len) >> 3; lVar6 = lVar6 + 1
        ) {
      server = *(Server **)(local_b8._M_len + lVar6 * 8);
      __y = RenX_ServerListPlugin::getListServerAddress(&pluginInstance,server);
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        uVar2 = RenX::Server::getPort();
        if (uVar2 == port) {
          RenX_ServerListPlugin::touchDetails(&pluginInstance,server);
          this = (string *)operator_new(0x20);
          puVar4 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
          uVar5 = Jupiter::Config::operator[](server + 0x70,puVar4[1],*puVar4);
          local_48 = (basic_string_view<char,_std::char_traits<char>_>)
                     Jupiter::Config::get(uVar5,1,"j",0,0);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)this,&local_48,&local_b9);
          goto LAB_001108ae;
        }
      }
    }
    this = (string *)operator_new(0x20);
    (this->_M_dataplus)._M_p = (pointer)&this->field_2;
    this->_M_string_length = 0;
    (this->field_2)._M_local_buf[0] = '\0';
LAB_001108ae:
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_b8);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&table._M_h);
  std::__cxx11::string::~string((string *)&parsed_query_string);
  return this;
}

Assistant:

std::string* handle_server_page(std::string_view query_string) {
	std::string parsed_query_string{ query_string };
	std::unordered_map<std::string_view, std::string_view, jessilib::text_hash, jessilib::text_equal> table;
	jessilib::deserialize_html_form(table, parsed_query_string);
	std::string_view address;
	unsigned short port = 0;
	RenX::Server *server;

	// parse form data

	if (table.size() < 2) {
		return new std::string();
	}

	if (table.size() != 0) {
		address = table["ip"sv];
		std::string_view port_str = table["port"sv];
		std::from_chars(port_str.data(), port_str.data() + port_str.size(), port, 10);
	}

	// search for server
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;

	while (true) {
		if (index == servers.size())
			return new std::string();

		server = servers[index];
		if (address == pluginInstance.getListServerAddress(*server) && server->getPort() == port)
			break;

		++index;
	}

	// return server data
	pluginInstance.touchDetails(*server);
	return new std::string(server->varData[pluginInstance.getName()].get("j"sv));
}